

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void soul::ResolutionPass::ModuleInstanceResolver::resolveSpecialisationArg
               (Expression *arg,ASTObject *param)

{
  bool bVar1;
  bool condition;
  UsingDeclaration *pUVar2;
  ProcessorBase *o;
  ProcessorAliasDeclaration *pPVar3;
  VariableDeclaration *pVVar4;
  NamespaceAliasDeclaration *pNVar5;
  pool_ptr<soul::AST::Namespace> local_90;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> local_88;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> n;
  Type local_78;
  pool_ptr<soul::AST::VariableDeclaration> local_60;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ptr<soul::AST::ProcessorBase> local_50;
  pool_ptr<soul::AST::ProcessorBase> pr;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> pa;
  pool_ptr<soul::AST::Expression> local_38 [3];
  pool_ptr<soul::AST::UsingDeclaration> local_20;
  pool_ptr<soul::AST::UsingDeclaration> u;
  ASTObject *param_local;
  Expression *arg_local;
  
  u.object = (UsingDeclaration *)param;
  cast<soul::AST::UsingDeclaration,soul::AST::ASTObject>((soul *)&local_20,param);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
  if (bVar1) {
    condition = AST::isResolvedAsType(arg);
    checkAssertion(condition,"AST::isResolvedAsType (arg)","resolveSpecialisationArg",0x282);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(local_38,arg);
    pUVar2 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_20);
    (pUVar2->targetType).object = local_38[0].object;
    pool_ptr<soul::AST::Expression>::~pool_ptr(local_38);
  }
  pool_ptr<soul::AST::UsingDeclaration>::~pool_ptr(&local_20);
  if (!bVar1) {
    cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>
              ((soul *)&pr,(ASTObject *)u.object);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&pr);
    if (bVar1) {
      (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_50);
      o = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_50);
      pool_ptr<soul::AST::ProcessorBase>::pool_ptr<soul::AST::ProcessorBase,void>
                ((pool_ptr<soul::AST::ProcessorBase> *)&v,o);
      pPVar3 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->
                         ((pool_ptr<soul::AST::ProcessorAliasDeclaration> *)&pr);
      (pPVar3->resolvedProcessor).object = (ProcessorBase *)v.object;
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr((pool_ptr<soul::AST::ProcessorBase> *)&v);
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_50);
    }
    pool_ptr<soul::AST::ProcessorAliasDeclaration>::~pool_ptr
              ((pool_ptr<soul::AST::ProcessorAliasDeclaration> *)&pr);
    if (!bVar1) {
      cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>
                ((soul *)&local_60,(ASTObject *)u.object);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_60);
      if (bVar1) {
        bVar1 = AST::isResolvedAsValue(arg);
        checkAssertion(bVar1,"AST::isResolvedAsValue (arg)","resolveSpecialisationArg",0x290);
        pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_60);
        bVar1 = AST::VariableDeclaration::isResolved(pVVar4);
        if (bVar1) {
          pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_60);
          AST::VariableDeclaration::getType(&local_78,pVVar4);
          SanityCheckPass::expectSilentCastPossible
                    (&(arg->super_Statement).super_ASTObject.context,&local_78,arg);
          Type::~Type(&local_78);
        }
        pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                  ((pool_ptr<soul::AST::Expression> *)&n,arg);
        pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_60);
        (pVVar4->initialValue).object = (Expression *)n.object;
        pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&n);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_60);
      if (!bVar1) {
        cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>
                  ((soul *)&local_88,(ASTObject *)u.object);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_88);
        if (bVar1) {
          (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_90);
          pNVar5 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_88);
          (pNVar5->resolvedNamespace).object = local_90.object;
          pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_90);
        }
        pool_ptr<soul::AST::NamespaceAliasDeclaration>::~pool_ptr(&local_88);
        if (!bVar1) {
          throwInternalCompilerError("resolveSpecialisationArg",0x29f);
        }
      }
    }
  }
  return;
}

Assistant:

static void resolveSpecialisationArg (AST::Expression& arg, AST::ASTObject& param)
        {
            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                SOUL_ASSERT (AST::isResolvedAsType (arg));
                u->targetType = arg;
                return;
            }

            if (auto pa = cast<AST::ProcessorAliasDeclaration> (param))
            {
                auto pr = arg.getAsProcessor();
                pa->resolvedProcessor = *pr;
                return;
            }

            if (auto v = cast<AST::VariableDeclaration> (param))
            {
                SOUL_ASSERT (AST::isResolvedAsValue (arg));

                if (v->isResolved())
                    SanityCheckPass::expectSilentCastPossible (arg.context, v->getType(), arg);

                v->initialValue = arg;
                return;
            }

            if (auto n = cast<AST::NamespaceAliasDeclaration> (param))
            {
                n->resolvedNamespace = arg.getAsNamespace();
                return;
            }

            SOUL_ASSERT_FALSE;
        }